

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Tracks::~Tracks(Tracks *this)

{
  Track **ppTVar1;
  Track **ppTVar2;
  
  ppTVar2 = this->m_trackEntries;
  ppTVar1 = this->m_trackEntriesEnd;
  if (ppTVar2 != ppTVar1) {
    do {
      if (*ppTVar2 != (Track *)0x0) {
        (*(*ppTVar2)->_vptr_Track[1])();
      }
      ppTVar2 = ppTVar2 + 1;
    } while (ppTVar2 != ppTVar1);
    ppTVar2 = this->m_trackEntries;
  }
  if (ppTVar2 == (Track **)0x0) {
    return;
  }
  operator_delete__(ppTVar2);
  return;
}

Assistant:

Tracks::~Tracks() {
  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;
    delete pTrack;
  }

  delete[] m_trackEntries;
}